

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Shell.cpp
# Opt level: O2

bool anon_unknown.dwarf_6a37::prefixed(string_view command,string_view prefix,string_view *suffix)

{
  bool bVar1;
  string_view sVar2;
  string_view command_local;
  
  command_local._len = command._len;
  command_local._ptr = command._ptr;
  bVar1 = mserialize::string_view::starts_with(&command_local,prefix);
  if (bVar1) {
    sVar2 = mserialize::string_view::substr(&command_local,prefix._len,0xffffffffffffffff);
    *suffix = sVar2;
  }
  return bVar1;
}

Assistant:

bool prefixed(mserialize::string_view command, mserialize::string_view prefix, mserialize::string_view& suffix)
{
  if (! command.starts_with(prefix)) { return false; }

  suffix = command.substr(prefix.size());
  return true;
}